

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall tchecker::clockbounds::df_solver_t::clear(df_solver_t *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->_dim != 0) {
    uVar1 = 0;
    do {
      uVar2 = this->_dim;
      if (uVar2 != 0) {
        uVar3 = 1;
        uVar4 = 0;
        do {
          this->_L[uVar2 * uVar1 + uVar4] = (db_t)0x7ffffffe;
          this->_U[this->_dim * uVar1 + uVar4] = (db_t)0x7ffffffe;
          uVar4 = (ulong)uVar3;
          uVar2 = this->_dim;
          uVar3 = uVar3 + 1;
        } while (uVar4 < uVar2);
      }
      this->_L[(uVar2 + 1) * uVar1] = (db_t)0x1;
      this->_U[(this->_dim + 1) * uVar1] = (db_t)0x1;
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (uVar1 < this->_dim);
  }
  this->_updated_L = false;
  this->_updated_U = false;
  return;
}

Assistant:

void df_solver_t::clear()
{
  // <inf everywhere except <=0 on diagonal
  for (tchecker::clock_id_t x = 0; x < _dim; ++x) {
    for (tchecker::clock_id_t y = 0; y < _dim; ++y) {
      _L[x * _dim + y] = tchecker::dbm::LT_INFINITY;
      _U[x * _dim + y] = tchecker::dbm::LT_INFINITY;
    }
    _L[x * _dim + x] = tchecker::dbm::LE_ZERO;
    _U[x * _dim + x] = tchecker::dbm::LE_ZERO;
  }

  _updated_L = false;
  _updated_U = false;
}